

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

WebPInfoStatus ProcessVP8XChunk(ChunkData *chunk_data,WebPInfo *webp_info)

{
  byte *pbVar1;
  int iVar2;
  uint8_t **data_00;
  uint *in_RSI;
  long in_RDI;
  uint8_t *data;
  WebPInfoStatus local_4;
  
  pbVar1 = *(byte **)(in_RDI + 0x10);
  if (((in_RSI[4] == 0) && (in_RSI[5] == 0)) && (in_RSI[6] == 0)) {
    if (*(long *)(in_RDI + 8) == 0x12) {
      in_RSI[6] = in_RSI[6] + 1;
      in_RSI[0x11] = (uint)*pbVar1;
      data_00 = (uint8_t **)(pbVar1 + 4);
      iVar2 = ReadLE24(data_00);
      *in_RSI = iVar2 + 1;
      iVar2 = ReadLE24(data_00);
      in_RSI[1] = iVar2 + 1;
      if (in_RSI[0x1b] == 0) {
        printf("  ICCP: %d\n  Alpha: %d\n  EXIF: %d\n  XMP: %d\n  Animation: %d\n",
               (ulong)((in_RSI[0x11] & 0x20) != 0),(ulong)((in_RSI[0x11] & 0x10) != 0),
               (ulong)((in_RSI[0x11] & 8) != 0),(ulong)((in_RSI[0x11] & 4) != 0),
               (ulong)((in_RSI[0x11] & 2) != 0));
        printf("  Canvas size %d x %d\n",(ulong)*in_RSI,(ulong)in_RSI[1]);
      }
      if (0x1000000 < (int)*in_RSI) {
        if (in_RSI[0x1c] != 0) {
          fprintf(_stderr,"Warning: %s\n","Canvas width is out of range in VP8X chunk.");
        }
        in_RSI[0x1e] = in_RSI[0x1e] + 1;
      }
      if (0x1000000 < (int)in_RSI[1]) {
        if (in_RSI[0x1c] != 0) {
          fprintf(_stderr,"Warning: %s\n","Canvas height is out of range in VP8X chunk.");
        }
        in_RSI[0x1e] = in_RSI[0x1e] + 1;
      }
      if (0x100000000 < (ulong)((long)(int)*in_RSI * (long)(int)in_RSI[1])) {
        if (in_RSI[0x1c] != 0) {
          fprintf(_stderr,"Warning: %s\n","Canvas area is out of range in VP8X chunk.");
        }
        in_RSI[0x1e] = in_RSI[0x1e] + 1;
      }
      local_4 = WEBP_INFO_OK;
    }
    else {
      if (in_RSI[0x1c] != 0) {
        fprintf(_stderr,"Error: %s\n","Corrupted VP8X chunk.");
      }
      local_4 = WEBP_INFO_PARSE_ERROR;
    }
  }
  else {
    if (in_RSI[0x1c] != 0) {
      fprintf(_stderr,"Error: %s\n","Already seen a VP8/VP8L/VP8X chunk when parsing VP8X chunk.");
    }
    local_4 = WEBP_INFO_PARSE_ERROR;
  }
  return local_4;
}

Assistant:

static WebPInfoStatus ProcessVP8XChunk(const ChunkData* const chunk_data,
                                       WebPInfo* const webp_info) {
  const uint8_t* data = chunk_data->payload_;
  if (webp_info->chunk_counts_[CHUNK_VP8] ||
      webp_info->chunk_counts_[CHUNK_VP8L] ||
      webp_info->chunk_counts_[CHUNK_VP8X]) {
    LOG_ERROR("Already seen a VP8/VP8L/VP8X chunk when parsing VP8X chunk.");
    return WEBP_INFO_PARSE_ERROR;
  }
  if (chunk_data->size_ != VP8X_CHUNK_SIZE + CHUNK_HEADER_SIZE) {
    LOG_ERROR("Corrupted VP8X chunk.");
    return WEBP_INFO_PARSE_ERROR;
  }
  ++webp_info->chunk_counts_[CHUNK_VP8X];
  webp_info->feature_flags_ = *data;
  data += 4;
  webp_info->canvas_width_ = 1 + ReadLE24(&data);
  webp_info->canvas_height_ = 1 + ReadLE24(&data);
  if (!webp_info->quiet_) {
    printf("  ICCP: %d\n  Alpha: %d\n  EXIF: %d\n  XMP: %d\n  Animation: %d\n",
           (webp_info->feature_flags_ & ICCP_FLAG) != 0,
           (webp_info->feature_flags_ & ALPHA_FLAG) != 0,
           (webp_info->feature_flags_ & EXIF_FLAG) != 0,
           (webp_info->feature_flags_ & XMP_FLAG) != 0,
           (webp_info->feature_flags_ & ANIMATION_FLAG) != 0);
    printf("  Canvas size %d x %d\n",
           webp_info->canvas_width_, webp_info->canvas_height_);
  }
  if (webp_info->canvas_width_ > MAX_CANVAS_SIZE) {
    LOG_WARN("Canvas width is out of range in VP8X chunk.");
  }
  if (webp_info->canvas_height_ > MAX_CANVAS_SIZE) {
    LOG_WARN("Canvas height is out of range in VP8X chunk.");
  }
  if ((uint64_t)webp_info->canvas_width_ * webp_info->canvas_height_ >
      MAX_IMAGE_AREA) {
    LOG_WARN("Canvas area is out of range in VP8X chunk.");
  }
  return WEBP_INFO_OK;
}